

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

Error __thiscall
llvm::
handleErrorImpl<llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__0,llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__1>
          (llvm *this,
          unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload,
          anon_class_48_6_0fa2c5c1 *Handler,anon_class_40_5_28e94b40 *Handlers)

{
  ErrorInfoBase *pEVar1;
  StringRef *Vals_2;
  int iVar2;
  raw_ostream *prVar3;
  uint *puVar4;
  char *__function;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  uint64_t local_40;
  uint32_t local_34;
  
  pEVar1 = (Payload->_M_t).
           super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>.
           _M_t.
           super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
           super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
  iVar2 = (*pEVar1->_vptr_ErrorInfoBase[6])(pEVar1,&DWARFDebugNames::SentinelError::ID);
  pEVar1 = (Payload->_M_t).
           super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>.
           _M_t.
           super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
           super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
  (Payload->_M_t).
  super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
  super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
  super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl = (ErrorInfoBase *)0x0;
  if ((char)iVar2 == '\0') {
    iVar2 = (*pEVar1->_vptr_ErrorInfoBase[6])(pEVar1,&ErrorInfoBase::ID);
    if ((char)iVar2 == '\0') {
      *(ulong *)this = (ulong)pEVar1 | 1;
      return (Error)(ErrorInfoBase *)this;
    }
    iVar2 = (*pEVar1->_vptr_ErrorInfoBase[6])(pEVar1,&ErrorInfoBase::ID);
    if ((char)iVar2 == '\0') {
      __function = 
      "static Error llvm::ErrorHandlerTraits<void (&)(llvm::ErrorInfoBase &)>::apply(HandlerT &&, std::unique_ptr<ErrorInfoBase>) [HandlerT = void (&)(llvm::ErrorInfoBase &), HandlerT = (lambda at /workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp:1270:19)]"
      ;
      goto LAB_00b4ff9a;
    }
    prVar3 = DWARFVerifier::error(Handlers->this);
    local_40 = Handlers->NI->Base;
    local_34 = Handlers->NTE->Index;
    Vals_2 = Handlers->Str;
    (*pEVar1->_vptr_ErrorInfoBase[3])(&local_60,pEVar1);
    formatv<unsigned_long,_unsigned_int,_llvm::StringRef_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              (&local_f8,"Name Index @ {0:x}: Name {1} ({2}): {3}\n",&local_40,&local_34,Vals_2,
               &local_60);
    raw_ostream::operator<<(prVar3,&local_f8.super_formatv_object_base);
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~formatv_object(&local_f8);
    std::__cxx11::string::~string((string *)&local_60);
    puVar4 = Handlers->NumErrors;
  }
  else {
    iVar2 = (*pEVar1->_vptr_ErrorInfoBase[6])(pEVar1,&DWARFDebugNames::SentinelError::ID);
    if ((char)iVar2 == '\0') {
      __function = 
      "static Error llvm::ErrorHandlerTraits<void (&)(llvm::DWARFDebugNames::SentinelError &)>::apply(HandlerT &&, std::unique_ptr<ErrorInfoBase>) [HandlerT = void (&)(llvm::DWARFDebugNames::SentinelError &), HandlerT = (lambda at /workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp:1262:19)]"
      ;
LAB_00b4ff9a:
      __assert_fail("appliesTo(*E) && \"Applying incorrect handler\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                    ,0x329,__function);
    }
    if (*Handler->NumEntries != 0) goto LAB_00b4ff40;
    prVar3 = DWARFVerifier::error(Handler->this);
    local_60._M_dataplus._M_p = (pointer)Handler->NI->Base;
    local_40 = CONCAT44(local_40._4_4_,Handler->NTE->Index);
    formatv<unsigned_long,_unsigned_int,_llvm::StringRef_&>
              ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>_>
                *)&local_f8,
               "Name Index @ {0:x}: Name {1} ({2}) is not associated with any entries.\n",
               (unsigned_long *)&local_60,(uint *)&local_40,Handler->Str);
    raw_ostream::operator<<(prVar3,&local_f8.super_formatv_object_base);
    formatv_object_base::~formatv_object_base(&local_f8.super_formatv_object_base);
    puVar4 = Handler->NumErrors;
  }
  *puVar4 = *puVar4 + 1;
LAB_00b4ff40:
  *(undefined8 *)this = 1;
  (*pEVar1->_vptr_ErrorInfoBase[1])(pEVar1);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error handleErrorImpl(std::unique_ptr<ErrorInfoBase> Payload,
                      HandlerT &&Handler, HandlerTs &&... Handlers) {
  if (ErrorHandlerTraits<HandlerT>::appliesTo(*Payload))
    return ErrorHandlerTraits<HandlerT>::apply(std::forward<HandlerT>(Handler),
                                               std::move(Payload));
  return handleErrorImpl(std::move(Payload),
                         std::forward<HandlerTs>(Handlers)...);
}